

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
               (string *s,char *fmt,unsigned_short *v,unsigned_short *args,unsigned_short *args_1,
               OctahedralVector *args_2,Vector3<float> *args_3,float *args_4,uint *args_5,
               float *args_6,uint *args_7,float *args_8,uint *args_9)

{
  long lVar1;
  ulong uVar2;
  ushort *in_RDX;
  string *in_RDI;
  string *in_R8;
  unsigned_short *in_R9;
  float *unaff_R12;
  uint *unaff_R13;
  float *unaff_R14;
  uint *unaff_R15;
  float *unaff_retaddr;
  uint *in_stack_00000008;
  unsigned_short *in_stack_00000010;
  string *in_stack_00000018;
  char *in_stack_00000020;
  string *in_stack_00000028;
  OctahedralVector *in_stack_00000038;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd20;
  char **in_stack_fffffffffffffd28;
  char **in_stack_fffffffffffffd30;
  Vector3<float> *in_stack_fffffffffffffd38;
  float *in_stack_fffffffffffffd40;
  uint *in_stack_fffffffffffffd48;
  undefined1 *puVar3;
  float *in_stack_fffffffffffffd50;
  float *in_stack_fffffffffffffd60;
  uint *in_stack_fffffffffffffd68;
  string local_280 [32];
  undefined8 local_260;
  char *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb4;
  char *in_stack_fffffffffffffdb8;
  LogLevel in_stack_fffffffffffffdc4;
  stringstream local_238 [16];
  undefined1 local_228 [376];
  string local_b0 [32];
  undefined4 local_90;
  undefined1 local_7b;
  byte local_7a;
  byte local_79;
  Vector3<float> *in_stack_ffffffffffffff88;
  OctahedralVector *in_stack_ffffffffffffff90;
  unsigned_short *in_stack_ffffffffffffff98;
  unsigned_short *in_stack_ffffffffffffffa0;
  
  copyToFormatString(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff88,0x2a);
  local_79 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff88,0x73);
  local_7a = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff88,100);
  local_7b = lVar1 != -1;
  if ((local_79 & 1) == 0) {
    if ((bool)local_7b) {
      puVar3 = &stack0xffffffffffffff88;
      uVar2 = std::__cxx11::string::find((char)puVar3,100);
      IntegerFormatTrait<unsigned_short>::fmt();
      std::__cxx11::string::replace((ulong)puVar3,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<unsigned_short_const&>
                ((char *)in_stack_fffffffffffffd38,(unsigned_short *)in_stack_fffffffffffffd30);
      std::__cxx11::string::operator+=(in_RDI,local_b0);
      std::__cxx11::string::~string(local_b0);
    }
    else if ((local_7a & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
                 in_stack_fffffffffffffda8);
      }
      std::__cxx11::string::c_str();
      formatOne<unsigned_short_const&>
                ((char *)in_stack_fffffffffffffd38,(unsigned_short *)in_stack_fffffffffffffd30);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_238);
      std::ostream::operator<<(local_228,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_260 = std::__cxx11::string::c_str();
      formatOne<char_const*>((char *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffda8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::stringstream::~stringstream(local_238);
    }
    stringPrintfRecursive<unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
              (in_R8,(char *)in_R9,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,unaff_R12,unaff_R13,unaff_R14,
               unaff_R15,unaff_retaddr,in_stack_00000008);
    local_90 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
               (unsigned_short *)in_stack_00000008,in_R9,in_stack_00000038,in_stack_fffffffffffffd38
               ,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,
               (uint *)&stack0xfffffffffffffcf8,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68)
    ;
    local_90 = 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}